

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariablePowerGeneralizationImpl.hpp
# Opt level: O3

Monom<Kernel::NumTraits<Kernel::RealConstantType>_> * __thiscall
Inferences::VariablePowerGeneralizationImpl::Generalize::operator()
          (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *__return_storage_ptr__,
          Generalize *this,Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *p,
          PolyNf *evaluatedArgs)

{
  ulong uVar1;
  uint i;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_e0;
  uint local_bc;
  uint local_b8 [2];
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_b0;
  RealConstantType local_a8;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> local_88;
  PolyNf *local_68;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariablePowerGeneralizationImpl_hpp:80:17),_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_60;
  
  local_bc = 0;
  local_68 = evaluatedArgs;
  Kernel::RealConstantType::RealConstantType(&local_a8,&p->numeral);
  local_60._iter._inner._func.a =
       (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)(p->factors)._ptr;
  local_60._iter._inner._inner._to =
       ((long)(local_60._iter._inner._func.a)->_cursor -
        (long)(local_60._iter._inner._func.a)->_stack >> 2) * 0x6db6db6db6db6db7;
  local_60._iter._inner._inner._next = 0;
  local_60._iter._inner._inner._from = 0;
  local_60._iter._func.this = this;
  local_60._iter._func.evaluatedArgs = &local_68;
  local_60._iter._func.i = &local_bc;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariablePowerGeneralizationImpl.hpp:80:17),_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::collect<Lib::Stack>(&local_e0,&local_60);
  local_88._factors._capacity = local_e0._capacity;
  local_e0._capacity = 0;
  local_88._factors._end = local_e0._end;
  local_e0._end = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  local_88._factors._stack = local_e0._stack;
  local_88._factors._cursor = local_e0._cursor;
  local_e0._stack = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  local_e0._cursor = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  Lib::
  perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
            ((Lib *)local_b8,&local_88);
  Kernel::RealConstantType::RealConstantType(&__return_storage_ptr__->numeral,&local_a8);
  (__return_storage_ptr__->factors)._id = local_b8[0];
  (__return_storage_ptr__->factors)._ptr = local_b0;
  if (local_88._factors._stack != (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0)
  {
    uVar1 = local_88._factors._capacity * 0x1c + 0xf & 0xfffffffffffffff0;
    if (uVar1 == 0) {
      *(undefined8 *)
       &((local_88._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_88._factors._stack;
    }
    else if (uVar1 < 0x11) {
      *(undefined8 *)
       &((local_88._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_88._factors._stack;
    }
    else if (uVar1 < 0x19) {
      *(undefined8 *)
       &((local_88._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_88._factors._stack;
    }
    else if (uVar1 < 0x21) {
      *(undefined8 *)
       &((local_88._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_88._factors._stack;
    }
    else if (uVar1 < 0x31) {
      *(undefined8 *)
       &((local_88._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_88._factors._stack;
    }
    else if (uVar1 < 0x41) {
      *(undefined8 *)
       &((local_88._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_88._factors._stack;
    }
    else {
      operator_delete(local_88._factors._stack,0x10);
    }
  }
  if (local_e0._stack != (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0) {
    uVar1 = local_e0._capacity * 0x1c + 0xf & 0xfffffffffffffff0;
    if (uVar1 == 0) {
      *(undefined8 *)
       &((local_e0._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_e0._stack;
    }
    else if (uVar1 < 0x11) {
      *(undefined8 *)
       &((local_e0._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_e0._stack;
    }
    else if (uVar1 < 0x19) {
      *(undefined8 *)
       &((local_e0._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_e0._stack;
    }
    else if (uVar1 < 0x21) {
      *(undefined8 *)
       &((local_e0._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_e0._stack;
    }
    else if (uVar1 < 0x31) {
      *(undefined8 *)
       &((local_e0._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_e0._stack;
    }
    else if (uVar1 < 0x41) {
      *(undefined8 *)
       &((local_e0._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_e0._stack;
    }
    else {
      operator_delete(local_e0._stack,0x10);
    }
  }
  mpz_clear(local_a8.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Monom<RealTraits> operator()(Monom<RealTraits> p, PolyNf* evaluatedArgs)  
  {
    unsigned i = 0;
    return Monom<RealTraits>(
        p.numeral, 
        perfect(MonomFactors<RealTraits>(
          p.factors->iter()
           .map([&](MonomFactor<RealTraits> m) 
             { 
                auto var = m.term.tryVar();
                if (var.isSome() && !powers.get(var.unwrap()).isBot()) {
                  ASS_EQ(evaluatedArgs[i], var.unwrap());
                  return MonomFactor<RealTraits>(evaluatedArgs[i++], 2 - ( m.power % 2 ));
                } else {
                  return MonomFactor<RealTraits>(evaluatedArgs[i++], m.power); 
                }
              })
           .template collect<Stack>())));
  }